

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void sfImage::preview_image(path *image_path,size_t width)

{
  bool bVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_00;
  allocator_type local_d9;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_d8;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_c0;
  string local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  size_type local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *pcStack_60;
  size_type local_58;
  pointer local_50;
  string local_40;
  
  local_68 = 0x1f;
  pcStack_60 = "command -v viu > /dev/null 2>&1";
  local_78 = 2;
  pcStack_70 = "-c";
  local_88._M_len = 2;
  local_88._M_str = "sh";
  __l._M_len = 3;
  __l._M_array = &local_88;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)&local_c0,__l,(allocator_type *)&local_40);
  bVar1 = sfUtils::taur_exec((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)&local_c0);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_c0);
  if (bVar1) {
    local_88._M_len = 3;
    local_88._M_str = "viu";
    std::filesystem::__cxx11::path::string(&local_40,image_path);
    local_78 = local_40._M_string_length;
    pcStack_70 = local_40._M_dataplus._M_p;
    local_68 = 2;
    pcStack_60 = "-w";
    std::__cxx11::to_string(&local_a8,width);
    local_58 = local_a8._M_string_length;
    local_50 = local_a8._M_dataplus._M_p;
    __l_00._M_len = 4;
    __l_00._M_array = &local_88;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&local_d8,__l_00,&local_d9);
    sfUtils::taur_exec((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)&local_d8);
    std::
    _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Vector_base(&local_d8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void sfImage::preview_image(const std::filesystem::path& image_path, const size_t width) {
  /* Check if `viu` is installed in the system */
  if (sfUtils::taur_exec({ "sh", "-c", "command -v viu > /dev/null 2>&1" })) {
    sfUtils::taur_exec({"viu", image_path.string(), "-w", std::to_string(width)});
  }

  return;
}